

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3Detection::Yolov3Detection(Yolov3Detection *this)

{
  Layer *pLVar1;
  undefined8 *in_RDI;
  ParamDict pd;
  Layer *in_stack_fffffffffffff6d0;
  Mat *this_00;
  undefined1 local_918 [40];
  Allocator *in_stack_fffffffffffff710;
  
  Layer::Layer(in_stack_fffffffffffff6d0);
  *in_RDI = &PTR__Yolov3Detection_001d8c60;
  this_00 = (Mat *)(in_RDI + 0x14);
  Mat::Mat(this_00);
  pLVar1 = create_layer((int)((ulong)in_RDI >> 0x20));
  in_RDI[0x1c] = pLVar1;
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff710);
  ParamDict::set((ParamDict *)local_918,0,0);
  (**(code **)(*(long *)in_RDI[0x1c] + 0x10))((long *)in_RDI[0x1c],local_918);
  pLVar1 = create_layer((int)((ulong)in_RDI >> 0x20));
  in_RDI[0x1d] = pLVar1;
  ParamDict::~ParamDict((ParamDict *)this_00);
  return;
}

Assistant:

Yolov3Detection::Yolov3Detection()
{
    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 0);
    softmax->load_param(pd);

    sigmoid = ncnn::create_layer(ncnn::LayerType::Sigmoid);
}